

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestNoTailForwarder::hold(TestNoTailForwarder *this,HoldContext context)

{
  Coroutine<void> *this_00;
  long *plVar1;
  Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  *this_01;
  PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>
  *__return_storage_ptr__;
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  *this_02;
  PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
  *__return_storage_ptr___00;
  undefined4 *puVar2;
  long *plVar3;
  long lVar4;
  SegmentBuilder *pSVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  long *plVar8;
  SourceLocation location;
  coroutine_handle<void> coroutine;
  WirePointer *pWVar9;
  ulong __n;
  undefined8 *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  int in_R8D;
  undefined8 uVar10;
  bool bVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  Own<capnp::ClientHook,_std::nullptr_t> OVar17;
  undefined1 local_68 [12];
  undefined4 uStack_5c;
  long *local_58;
  WirePointer *local_50;
  StructPointerCount local_44;
  uint local_40;
  CallContextHook *local_38;
  
  coroutine._M_fr_ptr = operator_new(0x8c0);
  *(code **)coroutine._M_fr_ptr = hold;
  *(code **)((long)coroutine._M_fr_ptr + 8) = hold;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  *(CallContextHook **)((long)coroutine._M_fr_ptr + 0x8b0) = context.hook;
  local_68._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  stack0xffffffffffffffa0 = "hold";
  local_58 = (long *)0x1500000854;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006bc5d0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006bc618;
  location.function = "hold";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  location.lineNumber = 0x854;
  location.columnNumber = 0x15;
  local_38 = context.hook;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006bc5d0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006bc618;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  *(Coroutine<void> **)&this->super_Server = this_00;
  (**(code **)*in_RDX)((undefined8 *)((long)coroutine._M_fr_ptr + 0x7d8));
  uVar10 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x7e0);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x7c8) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x7e8);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 2000) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x7f0);
  ((PointerReader *)((long)coroutine._M_fr_ptr + 0x7b8))->segment =
       *(SegmentReader **)((long)coroutine._M_fr_ptr + 0x7d8);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x7c0) = uVar10;
  PointerReader::getStruct
            ((StructReader *)local_68,(PointerReader *)((long)coroutine._M_fr_ptr + 0x7b8),
             (word *)0x0);
  bVar11 = local_44 != 0;
  pWVar9 = (WirePointer *)0x0;
  if (bVar11) {
    pWVar9 = local_50;
  }
  __n = 0x7fffffff;
  if (bVar11) {
    __n = (ulong)local_40;
  }
  uVar12 = 0;
  uVar13 = 0;
  uVar14 = 0;
  uVar15 = 0;
  if (bVar11) {
    uVar12 = local_68._0_4_;
    uVar13 = local_68._4_4_;
    uVar14 = local_68._8_4_;
    uVar15 = uStack_5c;
  }
  *(undefined4 *)((long)coroutine._M_fr_ptr + 0x798) = uVar12;
  *(undefined4 *)((long)coroutine._M_fr_ptr + 0x79c) = uVar13;
  *(undefined4 *)((long)coroutine._M_fr_ptr + 0x7a0) = uVar14;
  *(undefined4 *)((long)coroutine._M_fr_ptr + 0x7a4) = uVar15;
  *(WirePointer **)((long)coroutine._M_fr_ptr + 0x7a8) = pWVar9;
  *(int *)((long)coroutine._M_fr_ptr + 0x7b0) = (int)__n;
  PointerReader::getCapability((PointerReader *)((long)coroutine._M_fr_ptr + 0x870));
  plVar1 = (long *)((long)coroutine._M_fr_ptr + 0x840);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x848) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x870);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x850) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x878);
  *(pointer_____offset_0x10___ **)((long)coroutine._M_fr_ptr + 0x840) =
       &Capability::Client::typeinfo;
  if (*(char *)&local_38[4]._vptr_CallContextHook == '\x01') {
    (((Maybe<capnp::MessageSize> *)((long)coroutine._M_fr_ptr + 0x828))->ptr).isSet = false;
    capnproto_test::capnp::test::TestMoreStuff::Client::echoRequest
              ((Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
                *)((long)coroutine._M_fr_ptr + 0x6e0),(Client *)(local_38 + 5),
               (Maybe<capnp::MessageSize> *)((long)coroutine._M_fr_ptr + 0x828));
    (**(code **)(**(long **)((long)coroutine._M_fr_ptr + *(long *)(*plVar1 + -0x18) + 0x848) + 0x20)
    )((long)coroutine._M_fr_ptr + 0x880);
    unique0x10000681 = *(char **)((long)coroutine._M_fr_ptr + 0x880);
    local_58 = *(long **)((long)coroutine._M_fr_ptr + 0x888);
    local_68._0_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x858) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6e0);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x860) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6e8);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x868) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6f8);
    PointerBuilder::setCapability
              ((PointerBuilder *)((long)coroutine._M_fr_ptr + 0x858),
               (Own<capnp::ClientHook,_std::nullptr_t> *)(local_68 + 8));
    plVar3 = local_58;
    __buf = extraout_RDX;
    if (local_58 != (long *)0x0) {
      local_58 = (long *)0x0;
      (**((CapTableReader *)stack0xffffffffffffffa0)->_vptr_CapTableReader)
                (stack0xffffffffffffffa0,(long)plVar3 + *(long *)(*plVar3 + -0x10));
      __buf = extraout_RDX_00;
    }
    this_01 = (Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
               *)((long)coroutine._M_fr_ptr + 0x748);
    Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
    ::send(this_01,(int)(Request<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
                         *)((long)coroutine._M_fr_ptr + 0x6e0),__buf,__n,in_R8D);
    __return_storage_ptr__ =
         (PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>
          *)((long)coroutine._M_fr_ptr + 0x430);
    co_await<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>>
              (__return_storage_ptr__,
               (Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_> *
               )this_01);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x8b8) = 0;
    bVar11 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                       ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
    if (bVar11) {
      return (PromiseBase)(PromiseBase)this;
    }
    kj::_::PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults>_>
    ::await_resume((Response<capnproto_test::capnp::test::TestMoreStuff::EchoResults> *)
                   ((long)coroutine._M_fr_ptr + 0x668),__return_storage_ptr__);
    if ((*(char *)((long)coroutine._M_fr_ptr + 0x5e0) == '\x01') &&
       (plVar3 = *(long **)((long)coroutine._M_fr_ptr + 0x620), plVar3 != (long *)0x0)) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x620) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x618))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x618),
                 (long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 0x448) == '\x01') {
      kj::Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x450));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
    lVar4 = *(long *)((long)coroutine._M_fr_ptr + 0x760);
    if (lVar4 != 0) {
      uVar10 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x768);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x760) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x768) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x770))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x770),lVar4,8,uVar10,uVar10,0);
      in_R8D = (int)uVar10;
    }
    plVar3 = *(long **)((long)coroutine._M_fr_ptr + 0x758);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x758) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x750))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x750),
                 (long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    pSVar5 = (this_01->super_Builder)._builder.segment;
    if (pSVar5 != (SegmentBuilder *)0x0) {
      (this_01->super_Builder)._builder.segment = (SegmentBuilder *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pSVar5);
    }
    if (*(short *)((long)coroutine._M_fr_ptr + 0x68c) == 0) {
      uVar13 = 0;
      uVar14 = 0;
      uVar15 = 0;
      uVar16 = 0;
      uVar12 = 0x7fffffff;
      __n = 0;
    }
    else {
      uVar13 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x668);
      uVar14 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x66c);
      uVar15 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x670);
      uVar16 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x674);
      __n = *(ulong *)((long)coroutine._M_fr_ptr + 0x680);
      uVar12 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x690);
    }
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x778) = uVar13;
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x77c) = uVar14;
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x780) = uVar15;
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x784) = uVar16;
    *(ulong *)((long)coroutine._M_fr_ptr + 0x788) = __n;
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x790) = uVar12;
    OVar17 = PointerReader::getCapability((PointerReader *)((long)coroutine._M_fr_ptr + 0x890));
    puVar6 = *(undefined8 **)((long)coroutine._M_fr_ptr + 0x890);
    plVar3 = *(long **)((long)coroutine._M_fr_ptr + 0x898);
    (**(code **)(*plVar3 + 0x20))
              ((undefined4 *)((long)coroutine._M_fr_ptr + 0x8a0),plVar3,OVar17.ptr);
    lVar4 = *(long *)(*plVar1 + -0x18);
    puVar7 = *(undefined8 **)((long)plVar1 + lVar4);
    plVar8 = *(long **)((long)coroutine._M_fr_ptr + lVar4 + 0x848);
    uVar12 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x8a4);
    uVar13 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x8a8);
    uVar14 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x8ac);
    puVar2 = (undefined4 *)((long)plVar1 + lVar4);
    *puVar2 = *(undefined4 *)((long)coroutine._M_fr_ptr + 0x8a0);
    puVar2[1] = uVar12;
    puVar2[2] = uVar13;
    puVar2[3] = uVar14;
    if (plVar8 != (long *)0x0) {
      (**(code **)*puVar7)(puVar7,(long)plVar8 + *(long *)(*plVar8 + -0x10));
    }
    (**(code **)*puVar6)(puVar6,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    plVar3 = *(long **)((long)coroutine._M_fr_ptr + 0x6a0);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6a0) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x698))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x698),
                 (long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    plVar3 = *(long **)((long)coroutine._M_fr_ptr + 0x710);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x710) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x708))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x708),
                 (long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x810) = 0;
  capnproto_test::capnp::test::TestMoreStuff::Client::holdRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
              *)((long)coroutine._M_fr_ptr + 0x6a8),
             (Client *)(*(long *)((long)coroutine._M_fr_ptr + 0x8b0) + 8),
             (Maybe<capnp::MessageSize> *)((long)coroutine._M_fr_ptr + 0x810));
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x7f8) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6a8);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x800) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6b0);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x808) =
       *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6c0);
  PointerBuilder::setCapability
            ((PointerBuilder *)((long)coroutine._M_fr_ptr + 0x7f8),
             (Own<capnp::ClientHook,_std::nullptr_t> *)
             ((long)plVar1 + *(long *)(*(long *)((long)coroutine._M_fr_ptr + 0x840) + -0x18)));
  this_02 = (Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
             *)((long)coroutine._M_fr_ptr + 0x718);
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::send(this_02,(int)(Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
                       *)((long)coroutine._M_fr_ptr + 0x6a8),__buf_00,__n,in_R8D);
  __return_storage_ptr___00 =
       (PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> *)
       ((long)coroutine._M_fr_ptr + 0x238);
  co_await<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>>
            (__return_storage_ptr___00,
             (Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> *)
             this_02);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x8b8) = 1;
  bVar11 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                     ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
  if (!bVar11) {
    kj::_::PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
    ::await_resume((Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *)
                   ((long)coroutine._M_fr_ptr + 0x628),__return_storage_ptr___00);
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x660);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x660) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x658))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x658),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    if ((*(char *)((long)coroutine._M_fr_ptr + 1000) == '\x01') &&
       (plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x428), plVar1 != (long *)0x0)) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x428) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x420))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x420),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
      kj::Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr___00);
    lVar4 = *(long *)((long)coroutine._M_fr_ptr + 0x730);
    if (lVar4 != 0) {
      uVar10 = *(undefined8 *)((long)coroutine._M_fr_ptr + 0x738);
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x730) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x738) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x740))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x740),lVar4,8,uVar10,uVar10,0);
    }
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x728);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x728) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x720))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x720),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    pSVar5 = (this_02->super_Builder)._builder.segment;
    if (pSVar5 != (SegmentBuilder *)0x0) {
      (this_02->super_Builder)._builder.segment = (SegmentBuilder *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pSVar5);
    }
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x6d8);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x6d8) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x6d0))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x6d0),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    plVar1 = *(long **)((long)coroutine._M_fr_ptr + 0x850);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x850) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x848))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x848),
                 (long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x8b9));
    *(undefined8 *)coroutine._M_fr_ptr = 0;
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0x8b8) = 2;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> hold(HoldContext context) override {
    auto cap = context.getParams().getCap();

    // If we have a holdBouncer, bounce the capability through it first before forwarding on.
    KJ_IF_SOME(hb, holdBouncer) {
      auto req = hb.echoRequest();

      // HACK: echo() just reflects the cap back, but it was written to expect TestCallOrder
      //   specifically. We'll just pretend that's what we have, it doesn't matter.
      // TODO(cleanup): Change echo() to take `Capability` or maybe even be a generic.
      req.setCap(cap.castAs<test::TestCallOrder>());
      auto resp = co_await req.send();
      cap = resp.getCap().castAs<test::TestInterface>();
    }

    auto req = next.holdRequest();
    req.setCap(kj::mv(cap));
    co_await req.send();

    // (hold() has no results)
  }